

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O1

void crnlib::dxt_fast::find_representative_colors
               (uint n,color_quad_u8 *pBlock,color_quad_u8 *lo,color_quad_u8 *hi)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint32 uVar4;
  uint uVar5;
  ulong uVar6;
  uint i;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint i_1;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint iter_index;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  undefined2 *puVar18;
  uint *puVar19;
  bool bVar20;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined2 local_ba;
  char local_b8;
  undefined2 local_b7;
  char local_b5;
  uint local_b4;
  uint local_b0 [2];
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_84;
  int local_80;
  color_quad_u8 hi_color;
  color_quad_u8 lo_color;
  uint8 new_color8 [2] [3];
  uint weight [2];
  long alStack_60 [4];
  uint uStack_40;
  uint ave [3];
  
  uVar6 = (ulong)n;
  if (n == 0) {
    lVar7 = 0;
    lVar17 = 0;
    lVar16 = 0;
  }
  else {
    uVar11 = 0;
    lVar16 = 0;
    lVar17 = 0;
    lVar7 = 0;
    do {
      lVar7 = lVar7 + (ulong)pBlock[uVar11].field_0.field_0.r;
      lVar17 = lVar17 + (ulong)pBlock[uVar11].field_0.field_0.g;
      lVar16 = lVar16 + (ulong)pBlock[uVar11].field_0.field_0.b;
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  uVar12 = (ulong)(n >> 1);
  uVar11 = 0;
  local_84.m_u32 = (uint32)((lVar7 + uVar12) / uVar6);
  local_80 = (int)((lVar17 + uVar12) / uVar6);
  hi_color.field_0.m_u32 = SUB84((lVar16 + uVar12) / uVar6,0);
  if (n != 0) {
    iVar15 = -1;
    uVar12 = 0;
    do {
      iVar13 = pBlock[uVar12].field_0.field_0.r - local_84.m_u32;
      iVar14 = (uint)pBlock[uVar12].field_0.field_0.g - local_80;
      iVar10 = (uint)pBlock[uVar12].field_0.field_0.b - (int)hi_color.field_0;
      iVar10 = iVar10 * iVar10 + iVar14 * iVar14 + iVar13 * iVar13;
      if (iVar15 < iVar10) {
        uVar11 = uVar12 & 0xffffffff;
        iVar15 = iVar10;
      }
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  bVar1 = pBlock[uVar11].field_0.field_0.r;
  bVar2 = pBlock[uVar11].field_0.field_0.g;
  bVar3 = pBlock[uVar11].field_0.field_0.b;
  local_c0 = CONCAT13(pBlock[uVar11].field_0.field_0.a,CONCAT12(bVar3,CONCAT11(bVar2,bVar1)));
  uVar11 = 0;
  if (n != 0) {
    iVar15 = -1;
    uVar12 = 0;
    do {
      iVar13 = (uint)pBlock[uVar12].field_0.field_0.r - (uint)bVar1;
      iVar14 = (uint)pBlock[uVar12].field_0.field_0.g - (uint)bVar2;
      iVar10 = (uint)pBlock[uVar12].field_0.field_0.b - (uint)bVar3;
      iVar10 = iVar10 * iVar10 + iVar14 * iVar14 + iVar13 * iVar13;
      if (iVar15 < iVar10) {
        uVar11 = uVar12 & 0xffffffff;
        iVar15 = iVar10;
      }
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  local_c4._0_3_ =
       CONCAT12(pBlock[uVar11].field_0.field_0.b,
                CONCAT11(pBlock[uVar11].field_0.field_0.g,pBlock[uVar11].field_0.field_0.r));
  local_c4 = CONCAT13(pBlock[uVar11].field_0.field_0.a,(undefined3)local_c4);
  lVar7 = 0;
  do {
    uVar4 = (&local_84)[lVar7].m_u32;
    *(char *)((long)&local_c0 + lVar7) = (char)(*(byte *)((long)&local_c0 + lVar7) + uVar4 >> 1);
    *(char *)((long)&local_c4 + lVar7) = (char)(*(byte *)((long)&local_c4 + lVar7) + uVar4 >> 1);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  iVar15 = 0;
  local_b4 = n;
  while( true ) {
    if ((((uchar)local_c0 == (uchar)local_c4) && (local_c0._1_1_ == local_c4._1_1_)) &&
       (local_c0._2_1_ == local_c4._2_1_)) break;
    local_a0 = (ulong)local_c4._1_1_;
    local_90 = (ulong)local_c0._1_1_;
    local_a8 = (ulong)local_c4._2_1_;
    local_98 = (ulong)local_c0._2_1_;
    weight[0] = 0;
    weight[1] = 0;
    alStack_60[0] = 0;
    alStack_60[1] = 0;
    alStack_60[2] = 0;
    alStack_60[3] = 0;
    uStack_40 = 0;
    ave[0] = 0;
    local_b0[0] = 0;
    local_b0[1] = 0;
    if (local_b4 != 0) {
      iVar10 = (local_c4 & 0xff) - (local_c0 & 0xff);
      iVar14 = (uint)local_c4._1_1_ - (uint)local_c0._1_1_;
      iVar13 = (uint)local_c4._2_1_ - (uint)local_c0._2_1_;
      uVar11 = 0;
      do {
        bVar1 = pBlock[uVar11].field_0.field_0.r;
        bVar2 = pBlock[uVar11].field_0.field_0.g;
        bVar3 = pBlock[uVar11].field_0.field_0.b;
        uVar12 = (ulong)((int)(((local_c4 & 0xff) + (local_c0 & 0xff)) * iVar10 +
                               ((uint)local_c4._1_1_ + (uint)local_c0._1_1_) * iVar14 +
                              ((uint)local_c0._2_1_ + (uint)local_c4._2_1_) * iVar13) <
                        (int)(iVar13 * 2 * (uint)bVar3 +
                             iVar14 * 2 * (uint)bVar2 + iVar10 * 2 * (uint)bVar1));
        *(ulong *)(weight + uVar12 * 6) = *(long *)(weight + uVar12 * 6) + (ulong)bVar1;
        alStack_60[uVar12 * 3] = alStack_60[uVar12 * 3] + (ulong)bVar2;
        alStack_60[uVar12 * 3 + 1] = alStack_60[uVar12 * 3 + 1] + (ulong)bVar3;
        local_b0[uVar12] = local_b0[uVar12] + 1;
        uVar11 = uVar11 + 1;
      } while (uVar6 != uVar11);
    }
    if ((local_b0[0] == 0) || (local_b0[1] == 0)) break;
    puVar18 = &local_ba;
    puVar19 = weight;
    lVar7 = 0;
    do {
      uVar5 = local_b0[lVar7];
      lVar16 = 0;
      do {
        *(char *)((long)puVar18 + lVar16) =
             (char)((*(long *)(puVar19 + lVar16 * 2) + (ulong)(uVar5 >> 1)) / (ulong)uVar5);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      puVar19 = puVar19 + 6;
      puVar18 = (undefined2 *)((long)puVar18 + 3);
      bVar20 = lVar7 == 0;
      lVar7 = lVar7 + 1;
    } while (bVar20);
    if ((((char)local_ba == (uchar)local_c0) && (local_ba._1_1_ == (char)local_90)) &&
       ((local_b8 == (char)local_98 &&
        ((((char)local_b7 == (uchar)local_c4 && (local_b7._1_1_ == (char)local_a0)) &&
         (local_b5 == (char)local_a8)))))) break;
    local_c0 = CONCAT22(CONCAT11(local_c0._3_1_,local_b8),local_ba);
    local_c4._0_3_ = CONCAT12(local_b5,local_b7);
    iVar15 = iVar15 + 1;
    if (iVar15 == 4) break;
  }
  uVar5 = local_c0;
  lVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  do {
    uVar9 = uVar9 + (uint)*(byte *)((long)&local_c0 + lVar7) *
                    (uint)*(byte *)((long)&local_c0 + lVar7);
    uVar8 = uVar8 + (uint)*(byte *)((long)&local_c4 + lVar7) *
                    (uint)*(byte *)((long)&local_c4 + lVar7);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if (uVar8 < uVar9) {
    local_c0 = local_c4;
    local_c4 = uVar5;
  }
  (lo->field_0).field_0.r = (uchar)local_c0;
  (lo->field_0).field_0.g = local_c0._1_1_;
  (lo->field_0).field_0.b = local_c0._2_1_;
  (lo->field_0).field_0.a = local_c0._3_1_;
  (hi->field_0).field_0.r = (uchar)local_c4;
  (hi->field_0).field_0.g = local_c4._1_1_;
  (hi->field_0).field_0.b = local_c4._2_1_;
  (hi->field_0).field_0.a = local_c4._3_1_;
  return;
}

Assistant:

void find_representative_colors(uint n, const color_quad_u8* pBlock, color_quad_u8& lo, color_quad_u8& hi)
        {
            uint64 ave64[3];
            ave64[0] = 0;
            ave64[1] = 0;
            ave64[2] = 0;

            for (uint i = 0; i < n; i++)
            {
                ave64[0] += pBlock[i].r;
                ave64[1] += pBlock[i].g;
                ave64[2] += pBlock[i].b;
            }

            uint ave[3];
            ave[0] = static_cast<uint>((ave64[0] + (n / 2)) / n);
            ave[1] = static_cast<uint>((ave64[1] + (n / 2)) / n);
            ave[2] = static_cast<uint>((ave64[2] + (n / 2)) / n);

            int furthest_dist = -1;
            uint furthest_index = 0;
            for (uint i = 0; i < n; i++)
            {
                int r = pBlock[i].r - ave[0];
                int g = pBlock[i].g - ave[1];
                int b = pBlock[i].b - ave[2];
                int dist = r * r + g * g + b * b;
                if (dist > furthest_dist)
                {
                    furthest_dist = dist;
                    furthest_index = i;
                }
            }

            color_quad_u8 lo_color(pBlock[furthest_index]);

            int opp_dist = -1;
            uint opp_index = 0;
            for (uint i = 0; i < n; i++)
            {
                int r = pBlock[i].r - lo_color.r;
                int g = pBlock[i].g - lo_color.g;
                int b = pBlock[i].b - lo_color.b;
                int dist = r * r + g * g + b * b;
                if (dist > opp_dist)
                {
                    opp_dist = dist;
                    opp_index = i;
                }
            }

            color_quad_u8 hi_color(pBlock[opp_index]);

            for (uint i = 0; i < 3; i++)
            {
                lo_color[i] = static_cast<uint8>((lo_color[i] + ave[i]) >> 1);
                hi_color[i] = static_cast<uint8>((hi_color[i] + ave[i]) >> 1);
            }

            const uint cMaxIters = 4;
            for (uint iter_index = 0; iter_index < cMaxIters; iter_index++)
            {
                if ((lo_color[0] == hi_color[0]) && (lo_color[1] == hi_color[1]) && (lo_color[2] == hi_color[2]))
                {
                    break;
                }

                uint64 new_color[2][3];
                uint weight[2];

                utils::zero_object(new_color);
                utils::zero_object(weight);

                int vec_r = hi_color[0] - lo_color[0];
                int vec_g = hi_color[1] - lo_color[1];
                int vec_b = hi_color[2] - lo_color[2];

                int lo_dot = vec_r * lo_color[0] + vec_g * lo_color[1] + vec_b * lo_color[2];
                int hi_dot = vec_r * hi_color[0] + vec_g * hi_color[1] + vec_b * hi_color[2];
                int mid_dot = lo_dot + hi_dot;

                vec_r *= 2;
                vec_g *= 2;
                vec_b *= 2;

                for (uint i = 0; i < n; i++)
                {
                    const color_quad_u8& c = pBlock[i];

                    const int dot = c[0] * vec_r + c[1] * vec_g + c[2] * vec_b;
                    const uint match_index = (dot > mid_dot);

                    new_color[match_index][0] += c.r;
                    new_color[match_index][1] += c.g;
                    new_color[match_index][2] += c.b;
                    weight[match_index]++;
                }

                if ((!weight[0]) || (!weight[1]))
                {
                    break;
                }

                uint8 new_color8[2][3];

                for (uint j = 0; j < 2; j++)
                {
                    for (uint i = 0; i < 3; i++)
                    {
                        new_color8[j][i] = static_cast<uint8>((new_color[j][i] + (weight[j] / 2)) / weight[j]);
                    }
                }

                if ((new_color8[0][0] == lo_color[0]) && (new_color8[0][1] == lo_color[1]) && (new_color8[0][2] == lo_color[2]) &&
                    (new_color8[1][0] == hi_color[0]) && (new_color8[1][1] == hi_color[1]) && (new_color8[1][2] == hi_color[2]))
                {
                    break;
                }

                for (uint i = 0; i < 3; i++)
                {
                    lo_color[i] = new_color8[0][i];
                    hi_color[i] = new_color8[1][i];
                }
            }

            uint energy[2] = { 0, 0 };
            for (uint i = 0; i < 3; i++)
            {
                energy[0] += lo_color[i] * lo_color[i];
                energy[1] += hi_color[i] * hi_color[i];
            }

            if (energy[0] > energy[1])
            {
                std::swap(lo_color, hi_color);
            }

            lo = lo_color;
            hi = hi_color;
        }